

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# znzlib.c
# Opt level: O3

size_t znzread(void *buf,size_t size,size_t nmemb,znzFile file)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (file == (znzFile)0x0) {
    sVar3 = 0;
  }
  else {
    if (file->zfptr == (gzFile)0x0) {
      sVar2 = fread(buf,size,nmemb,(FILE *)file->nzfptr);
      return sVar2;
    }
    uVar5 = nmemb * size;
    if (uVar5 == 0) {
      uVar5 = 0;
    }
    else {
      do {
        uVar4 = 0x40000000;
        if (uVar5 < 0x40000000) {
          uVar4 = uVar5;
        }
        uVar1 = gzread(file->zfptr,buf,uVar4 & 0xffffffff);
        if ((int)uVar1 < 0) {
          return (long)(int)uVar1;
        }
        uVar5 = uVar5 - uVar1;
      } while (((uint)uVar4 <= uVar1) && (buf = (void *)((long)buf + (ulong)uVar1), uVar5 != 0));
      if (uVar5 < size && uVar5 != 0) {
        fprintf(_stderr,"** znzread: read short by %u bytes\n",uVar5 & 0xffffffff);
      }
    }
    sVar3 = nmemb - uVar5 / size;
  }
  return sVar3;
}

Assistant:

size_t znzread(void* buf, size_t size, size_t nmemb, znzFile file)
{
  size_t     remain = size*nmemb;
  char     * cbuf = (char *)buf;
  unsigned   n2read;
  int        nread;

  if (file==NULL) { return 0; }
#ifdef HAVE_ZLIB
  if (file->zfptr!=NULL) {
    /* gzread/write take unsigned int length, so maybe read in int pieces
       (noted by M Hanke, example given by M Adler)   6 July 2010 [rickr] */
    while( remain > 0 ) {
       n2read = (remain < ZNZ_MAX_BLOCK_SIZE) ? remain : ZNZ_MAX_BLOCK_SIZE;
       nread = gzread(file->zfptr, (void *)cbuf, n2read);
       if( nread < 0 ) return nread; /* returns -1 on error */

       remain -= nread;
       cbuf += nread;

       /* require reading n2read bytes, so we don't get stuck */
       if( nread < (int)n2read ) break;  /* return will be short */
    }

    /* warn of a short read that will seem complete */
    if( remain > 0 && remain < size )
       fprintf(stderr,"** znzread: read short by %u bytes\n",(unsigned)remain);

    return nmemb - remain/size;   /* return number of members processed */
  }
#endif
  return fread(buf,size,nmemb,file->nzfptr);
}